

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_sky.cpp
# Opt level: O0

void __thiscall
GLWall::SkyTop(GLWall *this,seg_t *seg,sector_t *fs,sector_t *bs,vertex_t *v1,vertex_t *v2)

{
  bool bVar1;
  int iVar2;
  FPortal *pFVar3;
  FPortal *pFVar4;
  float fVar5;
  double dVar6;
  double dVar7;
  FPortal *pback;
  FPortal *pfront;
  int type;
  float backreflect;
  float frontreflect;
  FTexture *local_58;
  FTexture *tex;
  FTexture *local_48;
  FTexture *tex_1;
  vertex_t *local_38;
  vertex_t *v2_local;
  vertex_t *v1_local;
  sector_t *bs_local;
  sector_t *fs_local;
  seg_t *seg_local;
  GLWall *this_local;
  
  local_38 = v2;
  v2_local = v1;
  v1_local = (vertex_t *)bs;
  bs_local = fs;
  fs_local = (sector_t *)seg;
  seg_local = (seg_t *)this;
  tex_1._4_4_ = sector_t::GetTexture(fs,1);
  bVar1 = FTextureID::operator==((FTextureID *)((long)&tex_1 + 4),&skyflatnum);
  if (bVar1) {
    if (*(short *)&v1_local[4].heightlist == 0x59) {
      return;
    }
    tex_1._0_4_ = sector_t::GetTexture((sector_t *)v1_local,1);
    bVar1 = FTextureID::operator==((FTextureID *)&tex_1,&skyflatnum);
    if (bVar1) {
      dVar6 = secplane_t::ZatPoint((secplane_t *)&v1_local[3].heightlist,v2_local);
      dVar7 = secplane_t::ZatPoint((secplane_t *)&v1_local[3].p.Y,v2_local);
      if (dVar7 < dVar6) {
        return;
      }
      dVar6 = secplane_t::ZatPoint((secplane_t *)&v1_local[3].heightlist,local_38);
      dVar7 = secplane_t::ZatPoint((secplane_t *)&v1_local[3].p.Y,local_38);
      if (dVar7 < dVar6) {
        return;
      }
      if ((v1_local[9].dirty & 1U) != 0) {
        return;
      }
      bVar1 = secplane_t::isSlope((secplane_t *)&v1_local[3].p.Y);
      if ((!bVar1) && (bVar1 = secplane_t::isSlope(&bs_local->floorplane), !bVar1)) {
        dVar6 = sector_t::GetPlaneTexZ((sector_t *)v1_local,0);
        dVar7 = sector_t::GetPlaneTexZ(bs_local,0);
        if ((dVar6 == dVar7 + 1.0) && (!NAN(dVar6) && !NAN(dVar7 + 1.0))) {
          tex._4_4_ = side_t::GetTexture((side_t *)fs_local->planes[0].xform.baseyOffs,2);
          local_48 = FTextureManager::operator()(&TexMan,tex._4_4_,false);
          if (local_48 == (FTexture *)0x0) {
            return;
          }
          if (local_48->UseType == '\r') {
            return;
          }
          tex._0_4_ = side_t::GetTexture((side_t *)fs_local->planes[0].xform.baseyOffs,1);
          local_48 = FTextureManager::operator()(&TexMan,tex._0_4_,false);
          if (((local_48 != (FTexture *)0x0) &&
              ((*(uint *)((long)fs_local->planes[0].xform.xScale + 0x20) & 8) == 0)) &&
             (dVar6 = side_t::GetTextureYOffset((side_t *)fs_local->planes[0].xform.baseyOffs,1),
             0.0 < dVar6)) {
            this->ztop[1] = 32768.0;
            this->ztop[0] = 32768.0;
            dVar6 = secplane_t::ZatPoint((secplane_t *)&v1_local[3].heightlist,local_38);
            dVar7 = side_t::GetTextureYOffset((side_t *)fs_local->planes[0].xform.baseyOffs,1);
            this->zbottom[1] = (float)(dVar6 + dVar7);
            this->zbottom[0] = (float)(dVar6 + dVar7);
            SkyPlane(this,bs_local,1,false);
            return;
          }
        }
      }
    }
    this->ztop[1] = 32768.0;
    this->ztop[0] = 32768.0;
    frontreflect = (float)side_t::GetTexture((side_t *)fs_local->planes[0].xform.baseyOffs,0);
    local_58 = FTextureManager::operator()(&TexMan,(FTextureID)frontreflect,false);
    backreflect = (float)sector_t::GetTexture((sector_t *)v1_local,1);
    bVar1 = FTextureID::operator!=((FTextureID *)&backreflect,&skyflatnum);
    if (bVar1) {
      this->zbottom[0] = this->zceil[0];
      this->zbottom[1] = this->zceil[1];
    }
    else {
      dVar6 = secplane_t::ZatPoint((secplane_t *)&v1_local[3].heightlist,v2_local);
      this->zbottom[0] = (float)dVar6;
      dVar6 = secplane_t::ZatPoint((secplane_t *)&v1_local[3].heightlist,local_38);
      this->zbottom[1] = (float)dVar6;
      this->flags = this->flags | 4;
    }
  }
  else {
    fVar5 = sector_t::GetReflect(bs_local,1);
    if (fVar5 <= 0.0) {
      iVar2 = sector_t::GetPortalType(bs_local,1);
      if (((iVar2 == 1) || (iVar2 == 2)) || (iVar2 == 3)) {
        pFVar3 = sector_t::GetGLPortal(bs_local,1);
        pFVar4 = sector_t::GetGLPortal((sector_t *)v1_local,1);
        if (pFVar3 == (FPortal *)0x0) {
          return;
        }
        bVar1 = sector_t::PortalBlocksView(bs_local,1);
        if (bVar1) {
          return;
        }
        if ((pFVar3 == pFVar4) &&
           (bVar1 = sector_t::PortalBlocksView((sector_t *)v1_local,1), !bVar1)) {
          return;
        }
      }
    }
    else {
      fVar5 = sector_t::GetReflect((sector_t *)v1_local,1);
      if (0.0 < fVar5) {
        dVar6 = secplane_t::fD((secplane_t *)&v1_local[3].heightlist);
        dVar7 = secplane_t::fD(&bs_local->ceilingplane);
        if ((dVar6 == dVar7) && (!NAN(dVar6) && !NAN(dVar7))) {
          return;
        }
      }
    }
    this->ztop[1] = 32768.0;
    this->ztop[0] = 32768.0;
    dVar6 = secplane_t::ZatPoint(&bs_local->ceilingplane,v2_local);
    this->zbottom[0] = (float)dVar6;
    dVar6 = secplane_t::ZatPoint(&bs_local->ceilingplane,local_38);
    this->zbottom[1] = (float)dVar6;
  }
  SkyPlane(this,bs_local,1,true);
  return;
}

Assistant:

void GLWall::SkyTop(seg_t * seg,sector_t * fs,sector_t * bs,vertex_t * v1,vertex_t * v2)
{
	if (fs->GetTexture(sector_t::ceiling)==skyflatnum)
	{
		if (bs->special == GLSector_NoSkyDraw) return;
		if (bs->GetTexture(sector_t::ceiling)==skyflatnum) 
		{
			// if the back sector is closed the sky must be drawn!
			if (bs->ceilingplane.ZatPoint(v1) > bs->floorplane.ZatPoint(v1) ||
				bs->ceilingplane.ZatPoint(v2) > bs->floorplane.ZatPoint(v2) || bs->transdoor)
					return;

			// one more check for some ugly transparent door hacks
			if (!bs->floorplane.isSlope() && !fs->floorplane.isSlope())
			{
				if (bs->GetPlaneTexZ(sector_t::floor)==fs->GetPlaneTexZ(sector_t::floor)+1.)
				{
					FTexture * tex = TexMan(seg->sidedef->GetTexture(side_t::bottom));
					if (!tex || tex->UseType==FTexture::TEX_Null) return;

					// very, very, very ugly special case (See Icarus MAP14)
					// It is VERY important that this is only done for a floor height difference of 1
					// or it will cause glitches elsewhere.
					tex = TexMan(seg->sidedef->GetTexture(side_t::mid));
					if (tex != NULL && !(seg->linedef->flags & ML_DONTPEGTOP) &&
						seg->sidedef->GetTextureYOffset(side_t::mid) > 0)
					{
						ztop[0]=ztop[1]=32768.0f;
						zbottom[0]=zbottom[1]= 
							bs->ceilingplane.ZatPoint(v2) + seg->sidedef->GetTextureYOffset(side_t::mid);
						SkyPlane(fs, sector_t::ceiling, false);
						return;
					}
				}
			}
		}

		ztop[0]=ztop[1]=32768.0f;

		FTexture * tex = TexMan(seg->sidedef->GetTexture(side_t::top));
		if (bs->GetTexture(sector_t::ceiling) != skyflatnum)

		{
			zbottom[0]=zceil[0];
			zbottom[1]=zceil[1];
		}
		else
		{
			zbottom[0] = bs->ceilingplane.ZatPoint(v1);
			zbottom[1] = bs->ceilingplane.ZatPoint(v2);
			flags|=GLWF_SKYHACK;	// mid textures on such lines need special treatment!
		}
	}
	else 
	{
		float frontreflect = fs->GetReflect(sector_t::ceiling);
		if (frontreflect > 0)
		{
			float backreflect = bs->GetReflect(sector_t::ceiling);
			if (backreflect > 0 && bs->ceilingplane.fD() == fs->ceilingplane.fD())
			{
				// Don't add intra-portal line to the portal.
				return;
			}
		}
		else
		{
			int type = fs->GetPortalType(sector_t::ceiling);
			if (type == PORTS_STACKEDSECTORTHING || type == PORTS_PORTAL || type == PORTS_LINKEDPORTAL)
			{
				FPortal *pfront = fs->GetGLPortal(sector_t::ceiling);
				FPortal *pback = bs->GetGLPortal(sector_t::ceiling);
				if (pfront == NULL || fs->PortalBlocksView(sector_t::ceiling)) return;
				if (pfront == pback && !bs->PortalBlocksView(sector_t::ceiling)) return;
			}
		}

		// stacked sectors
		ztop[0] = ztop[1] = 32768.0f;
		zbottom[0] = fs->ceilingplane.ZatPoint(v1);
		zbottom[1] = fs->ceilingplane.ZatPoint(v2);

	}

	SkyPlane(fs, sector_t::ceiling, true);
}